

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>_>
               *this,SourceCollections *dst)

{
  Function p_Var1;
  CaseDef in_stack_ffffffffffffffb8;
  
  p_Var1 = (this->m_progs).m_func;
  vkt::image::anon_unknown_1::CaseDef::CaseDef
            ((CaseDef *)&stack0xffffffffffffffc4,&(this->m_arg0).arg0);
  (*p_Var1)(dst,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }